

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O0

bool log_is_valid_callstack(int callstack_depth,void **callstack,bool is_alloc)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  char *pcVar4;
  mapped_type *this;
  ulong uVar5;
  allocator local_b1;
  string local_b0 [32];
  char *local_90;
  char *fname;
  Dl_info dlinfo;
  _Self local_50;
  iterator it;
  void *addr;
  string objfile;
  int local_20;
  int i;
  bool is_alloc_local;
  void **callstack_local;
  int callstack_depth_local;
  
  std::__cxx11::string::string((string *)&addr);
  for (local_20 = callstack_depth + -1; 0 < local_20; local_20 = local_20 + -1) {
    it._M_node = (_Base_ptr)callstack[local_20];
    local_50._M_node =
         (_Base_ptr)
         std::
         map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(objfile_cache_abi_cxx11_,&it._M_node);
    dlinfo.dli_saddr =
         (void *)std::
                 map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(objfile_cache_abi_cxx11_);
    bVar1 = std::operator!=(&local_50,(_Self *)&dlinfo.dli_saddr);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_50);
      std::__cxx11::string::operator=((string *)&addr,(string *)&ppVar3->second);
    }
    else {
      iVar2 = dladdr(it._M_node,&fname);
      if (((iVar2 != 0) && (fname != (char *)0x0)) &&
         (local_90 = strdup(fname), local_90 != (char *)0x0)) {
        pcVar4 = __xpg_basename(local_90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b0,pcVar4,&local_b1);
        std::__cxx11::string::operator=((string *)&addr,local_b0);
        std::__cxx11::string::~string(local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        this = std::
               map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](objfile_cache_abi_cxx11_,&it._M_node);
        std::__cxx11::string::operator=((string *)this,(string *)&addr);
        free(local_90);
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) break;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((((uVar5 & 1) != 0) || (is_alloc)) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &addr,"libobjc.A.dylib"), !bVar1)) {
    callstack_local._7_1_ = true;
  }
  else {
    callstack_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)&addr);
  return callstack_local._7_1_;
}

Assistant:

bool log_is_valid_callstack(int callstack_depth, void * const callstack[], bool is_alloc)
{
  int i = callstack_depth - 1;
  std::string objfile;
  while (i > 0)
  {
    void *addr = callstack[i];

    auto it = objfile_cache->find(addr);
    if (it != objfile_cache->end())
    {
      objfile = it->second;
    }
    else
    {
      Dl_info dlinfo;
      if (dladdr(addr, &dlinfo) && dlinfo.dli_fname)
      {
        char *fname = strdup(dlinfo.dli_fname);
        if (fname)
        {
          objfile = std::string(basename(fname));
          (*objfile_cache)[addr] = objfile;
          free(fname);
        }
      }
    }

    if (!objfile.empty())
    {
      // For now only care about originating object file
      break;
    }
      
    --i;
  }

  if (!objfile.empty())
  {
      // ignore invalid dealloc from libobjc
      if (!is_alloc && (objfile == "libobjc.A.dylib")) return false;
  }

  return true;
}